

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTAudioEngine_SetVolume(FACTAudioEngine *pEngine,uint16_t nCategory,float volume)

{
  undefined6 in_register_00000032;
  long lVar1;
  ulong uVar2;
  
  uVar2 = CONCAT62(in_register_00000032,nCategory) & 0xffffffff;
  FAudio_PlatformLockMutex(pEngine->apiLock);
  pEngine->categories[uVar2].currentVolume = volume * pEngine->categories[uVar2].volume;
  lVar1 = 0x14;
  for (uVar2 = 0; uVar2 < pEngine->categoryCount; uVar2 = uVar2 + 1) {
    if ((int)*(short *)((long)pEngine->categories + lVar1 + -0xc) ==
        (int)CONCAT62(in_register_00000032,nCategory)) {
      FACTAudioEngine_SetVolume
                (pEngine,(uint16_t)uVar2,*(float *)(&pEngine->categories->instanceLimit + lVar1));
    }
    lVar1 = lVar1 + 0x18;
  }
  FAudio_PlatformUnlockMutex(pEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_SetVolume(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	float volume
) {
	uint16_t i;
	FAudio_PlatformLockMutex(pEngine->apiLock);
	pEngine->categories[nCategory].currentVolume = (
		pEngine->categories[nCategory].volume *
		volume
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		if (pEngine->categories[i].parentCategory == nCategory)
		{
			FACTAudioEngine_SetVolume(
				pEngine,
				i,
				pEngine->categories[i].currentVolume
			);
		}
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}